

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

uint8_t * __thiscall
icu_63::ResourceDataValue::getBinary(ResourceDataValue *this,int32_t *length,UErrorCode *errorCode)

{
  UBool UVar1;
  uint8_t *b;
  UErrorCode *errorCode_local;
  int32_t *length_local;
  ResourceDataValue *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    this_local = (ResourceDataValue *)res_getBinary_63(this->pResData,this->res,length);
    if (this_local == (ResourceDataValue *)0x0) {
      *errorCode = U_RESOURCE_TYPE_MISMATCH;
    }
  }
  else {
    this_local = (ResourceDataValue *)0x0;
  }
  return (uint8_t *)this_local;
}

Assistant:

const uint8_t *ResourceDataValue::getBinary(int32_t &length, UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) {
        return NULL;
    }
    const uint8_t *b = res_getBinary(pResData, res, &length);
    if(b == NULL) {
        errorCode = U_RESOURCE_TYPE_MISMATCH;
    }
    return b;
}